

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  char *pcVar1;
  curltime cVar2;
  undefined4 uStack_5c;
  long local_58;
  ssize_t bytes_written;
  ssize_t len;
  char *eob;
  pingpong *pp;
  SMTP *smtp;
  Curl_easy *data;
  undefined1 local_1d;
  CURLcode result;
  _Bool premature_local;
  connectdata *pcStack_18;
  CURLcode status_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  smtp = (SMTP *)conn->data;
  pp = (pingpong *)(((Curl_easy *)smtp)->req).protop;
  eob = (char *)&conn->proto;
  if ((pp == (pingpong *)0x0) || ((conn->proto).ftpc.pp.conn == (connectdata *)0x0)) {
    return CURLE_OK;
  }
  local_1d = premature;
  result = status;
  pcStack_18 = conn;
  (*Curl_cfree)((void *)pp->cache_size);
  pp->cache_size = 0;
  if (result == CURLE_OK) {
    if ((((smtp[0x4e].eob & 0x100) == 0) && (*(long *)(smtp + 0x5d) != 0)) &&
       (((smtp[0x4d].field_0x21 & 1) != 0 || ((int)smtp[0x34].eob != 0)))) {
      if (((pp->pending_resp & 1U) == 0) && ((pcStack_18->data->state).infilesize != 0)) {
        len = (ssize_t)(*Curl_cstrdup)("\r\n.\r\n");
        bytes_written = 5;
      }
      else {
        len = (ssize_t)(*Curl_cstrdup)(".\r\n");
        bytes_written = 3;
      }
      if (len == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      data._4_4_ = Curl_write(pcStack_18,pcStack_18->writesockfd,(void *)len,bytes_written,&local_58
                             );
      pcVar1 = eob;
      if (data._4_4_ != CURLE_OK) {
        (*Curl_cfree)((void *)len);
        return data._4_4_;
      }
      if (local_58 == bytes_written) {
        cVar2 = Curl_now();
        *(time_t *)(pcVar1 + 0x40) = cVar2.tv_sec;
        *(ulong *)(pcVar1 + 0x48) = CONCAT44(uStack_5c,cVar2.tv_usec);
        (*Curl_cfree)((void *)len);
      }
      else {
        *(ssize_t *)(eob + 0x28) = len;
        *(ssize_t *)(eob + 0x38) = bytes_written;
        *(ssize_t *)(eob + 0x30) = bytes_written - local_58;
      }
      state(pcStack_18,SMTP_POSTDATA);
      data._4_4_ = smtp_block_statemach(pcStack_18);
    }
  }
  else {
    Curl_conncontrol(pcStack_18,1);
    data._4_4_ = result;
  }
  *(undefined4 *)&pp->cache = 0;
  return data._4_4_;
}

Assistant:

static CURLcode smtp_done(struct connectdata *conn, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct SMTP *smtp = data->req.protop;
  struct pingpong *pp = &conn->proto.smtpc.pp;
  char *eob;
  ssize_t len;
  ssize_t bytes_written;

  (void)premature;

  if(!smtp || !pp->conn)
    return CURLE_OK;

  /* Cleanup our per-request based variables */
  Curl_safefree(smtp->custom);

  if(status) {
    connclose(conn, "SMTP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && data->set.mail_rcpt &&
          (data->set.upload || data->set.mimepost.kind)) {
    /* Calculate the EOB taking into account any terminating CRLF from the
       previous line of the email or the CRLF of the DATA command when there
       is "no mail data". RFC-5321, sect. 4.1.1.4.

       Note: As some SSL backends, such as OpenSSL, will cause Curl_write() to
       fail when using a different pointer following a previous write, that
       returned CURLE_AGAIN, we duplicate the EOB now rather than when the
       bytes written doesn't equal len. */
    if(smtp->trailing_crlf || !conn->data->state.infilesize) {
      eob = strdup(SMTP_EOB + 2);
      len = SMTP_EOB_LEN - 2;
    }
    else {
      eob = strdup(SMTP_EOB);
      len = SMTP_EOB_LEN;
    }

    if(!eob)
      return CURLE_OUT_OF_MEMORY;

    /* Send the end of block data */
    result = Curl_write(conn, conn->writesockfd, eob, len, &bytes_written);
    if(result) {
      free(eob);
      return result;
    }

    if(bytes_written != len) {
      /* The whole chunk was not sent so keep it around and adjust the
         pingpong structure accordingly */
      pp->sendthis = eob;
      pp->sendsize = len;
      pp->sendleft = len - bytes_written;
    }
    else {
      /* Successfully sent so adjust the response timeout relative to now */
      pp->response = Curl_now();

      free(eob);
    }

    state(conn, SMTP_POSTDATA);

    /* Run the state-machine

       TODO: when the multi interface is used, this _really_ should be using
       the smtp_multi_statemach function but we have no general support for
       non-blocking DONE operations!
    */
    result = smtp_block_statemach(conn);
  }

  /* Clear the transfer mode for the next request */
  smtp->transfer = FTPTRANSFER_BODY;

  return result;
}